

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coalesce.c
# Opt level: O3

int inform_coalesce(int *series,size_t n,int *coal,inform_error *err)

{
  undefined4 *__dest;
  size_t sVar1;
  undefined4 *__base;
  long lVar2;
  void *pvVar3;
  int iVar4;
  
  if (series != (int *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (coal != (int *)0x0) {
      __dest = (undefined4 *)malloc(n * 4);
      if (__dest == (undefined4 *)0x0) {
        if (err == (inform_error *)0x0) {
          return 0;
        }
        *err = INFORM_ENOMEM;
        return 0;
      }
      memcpy(__dest,series,n * 4);
      qsort(__dest,n,4,compare_ints);
      iVar4 = 1;
      if (n != 1) {
        sVar1 = 1;
        do {
          iVar4 = iVar4 + (uint)(__dest[sVar1] != __dest[sVar1 - 1]);
          sVar1 = sVar1 + 1;
        } while (n != sVar1);
      }
      __base = (undefined4 *)malloc((long)iVar4 * 4);
      if (__base != (undefined4 *)0x0) {
        *__base = *__dest;
        if (n != 1) {
          lVar2 = 1;
          sVar1 = 1;
          do {
            if (__dest[sVar1] != __dest[sVar1 - 1]) {
              __base[lVar2] = __dest[sVar1];
              lVar2 = lVar2 + 1;
            }
            sVar1 = sVar1 + 1;
          } while (n != sVar1);
        }
        free(__dest);
        sVar1 = 0;
        do {
          pvVar3 = bsearch(series,__base,(long)iVar4,4,compare_ints);
          if (pvVar3 == (void *)0x0) {
            free(__base);
            if (err == (inform_error *)0x0) {
              return 0;
            }
            *err = INFORM_EBIN;
            return 0;
          }
          coal[sVar1] = (int)((ulong)((long)pvVar3 - (long)__base) >> 2);
          sVar1 = sVar1 + 1;
          series = series + 1;
        } while (n != sVar1);
        free(__base);
        return iVar4;
      }
      free(__dest);
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ENOMEM;
      return 0;
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ETIMESERIES;
  }
  return 0;
}

Assistant:

int inform_coalesce(int const *series, size_t n, int *coal, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (coal == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int *tmp = malloc(n * sizeof(int));
    if (tmp == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    memcpy(tmp, series, n * sizeof(int));
    qsort(tmp, n, sizeof(int), compare_ints);
    int b = 1;
    for (size_t i = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) ++b;
    }

    int *map = malloc(b * sizeof(int));
    if (map == NULL)
    {
        free(tmp);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    map[0] = tmp[0];
    for (size_t i = 1, j = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) map[j++] = tmp[i];
    }
    free(tmp);

    for (size_t i = 0; i < n; ++i)
    {
        int *x = bsearch(series + i, map, b, sizeof(int), compare_ints);
        if (x == NULL)
        {
            free(map);
            INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
        }
        coal[i] = (int) (x - map);
    }

    free(map);
    return b;
}